

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *output,
               vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *input)

{
  VertexPacket *v0_;
  VertexPacket *v1_;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  Triangle local_48;
  int local_28;
  int local_24;
  int baseProvokingVertexIndex;
  int adjacentProvokingVertex;
  size_t i;
  vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *input_local;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *output_local;
  
  i = (size_t)input;
  input_local = (vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *)
                output;
  sVar2 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::size
                    (input);
  std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::resize(output,sVar2);
  _baseProvokingVertexIndex = 0;
  while( true ) {
    uVar1 = _baseProvokingVertexIndex;
    sVar2 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::size
                      ((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                        *)i);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
             operator[]((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         *)i,_baseProvokingVertexIndex);
    local_24 = pvVar3->provokingIndex;
    local_28 = local_24 / 2;
    pvVar3 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
             operator[]((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         *)i,_baseProvokingVertexIndex);
    v0_ = pvVar3->v0;
    pvVar3 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
             operator[]((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         *)i,_baseProvokingVertexIndex);
    v1_ = pvVar3->v2;
    pvVar3 = std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
             operator[]((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         *)i,_baseProvokingVertexIndex);
    pa::Triangle::Triangle(&local_48,v0_,v1_,pvVar3->v4,local_28);
    pvVar4 = std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::operator[]
                       ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)input_local,
                        _baseProvokingVertexIndex);
    pvVar4->v0 = local_48.v0;
    pvVar4->v1 = local_48.v1;
    pvVar4->v2 = local_48.v2;
    pvVar4->provokingIndex = local_48.provokingIndex;
    _baseProvokingVertexIndex = _baseProvokingVertexIndex + 1;
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Triangle>& output, std::vector<pa::TriangleAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex/2;
		output[i] = pa::Triangle(input[i].v0, input[i].v2, input[i].v4, baseProvokingVertexIndex);
	}
}